

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::StreamExpressionWithRangeSyntax::getChild
          (StreamExpressionWithRangeSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  Info *pIVar1;
  
  if (in_RDX == 0) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffb8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7cc2eb,token);
  }
  else if (in_RDX == 1) {
    pIVar1 = in_RDI;
    not_null<slang::syntax::ElementSelectSyntax_*>::get
              ((not_null<slang::syntax::ElementSelectSyntax_*> *)
               ((long)&in_RSI[1].
                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
               + 0x10));
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
    in_RDI = pIVar1;
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return (ConstTokenOrSyntax *)in_RDI;
}

Assistant:

ConstTokenOrSyntax StreamExpressionWithRangeSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return withKeyword;
        case 1: return range.get();
        default: return nullptr;
    }
}